

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_type_createMemberReferenceType(sysbvm_context_t *context,sysbvm_tuple_t baseType)

{
  sysbvm_tuple_t sVar1;
  
  sVar1 = sysbvm_memberAddressSpace_uniqueInstance(context);
  sVar1 = sysbvm_type_createReferenceType(context,baseType,sVar1);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createMemberReferenceType(sysbvm_context_t *context, sysbvm_tuple_t baseType)
{
    return sysbvm_type_createReferenceType(context, baseType, sysbvm_memberAddressSpace_uniqueInstance(context));
}